

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keygen.c
# Opt level: O3

int ulp_generate_key_pair
              (size_t n,size_t l,uint64_t sk,uint64_t se,uint64_t q,ulp_public_key **pub_key_p,
              ulp_private_key **priv_key_p)

{
  uint64_t *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulp_public_key *pub_key;
  ulp_private_key *priv_key;
  void *__ptr;
  uint64_t uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  size_t __nmemb;
  size_t sVar9;
  size_t k;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  
  iVar2 = -2;
  if (((((-1 < (long)q) && (n != 0)) && (l != 0)) && ((sk != 0 && (se != 0)))) &&
     ((q != 0 && ((pub_key_p != (ulp_public_key **)0x0 && (priv_key_p != (ulp_private_key **)0x0))))
     )) {
    pub_key = ulp_alloc_public_key(n,l);
    priv_key = ulp_alloc_private_key(n,l);
    __nmemb = l * n;
    __ptr = calloc(__nmemb,8);
    if (__ptr != (void *)0x0 &&
        (priv_key != (ulp_private_key *)0x0 && pub_key != (ulp_public_key *)0x0)) {
      pub_key->se = se;
      pub_key->q = q;
      priv_key->q = q;
      iVar2 = get_random_numbers(pub_key->A,n * n,q);
      iVar3 = get_random_numbers(pub_key->P,__nmemb,sk);
      iVar4 = get_random_numbers(priv_key->S,__nmemb,sk);
      if (iVar4 + iVar3 + iVar2 == 0) {
        lVar8 = 0;
        sVar6 = 0;
        do {
          sVar12 = 0;
          do {
            uVar7 = *(ulong *)((long)__ptr + sVar12 * 8 + sVar6 * n * 8);
            sVar10 = 0;
            sVar11 = sVar12;
            do {
              uVar5 = mulmod(*(uint64_t *)((long)priv_key->S + sVar10 * 8 + lVar8),
                             pub_key->A[sVar11],q);
              uVar7 = (uVar5 + uVar7) % q;
              sVar10 = sVar10 + 1;
              sVar11 = sVar11 + n;
            } while (n != sVar10);
            *(ulong *)((long)__ptr + sVar12 * 8 + sVar6 * n * 8) = uVar7;
            sVar12 = sVar12 + 1;
          } while (sVar12 != n);
          sVar6 = sVar6 + 1;
          lVar8 = lVar8 + n * 8;
        } while (sVar6 != l);
        if (__nmemb != 0) {
          puVar1 = pub_key->P;
          sVar9 = 0;
          do {
            puVar1[sVar9] = ((puVar1[sVar9] + q) - *(long *)((long)__ptr + sVar9 * 8)) % q;
            sVar9 = sVar9 + 1;
          } while (__nmemb != sVar9);
        }
        free(__ptr);
        *pub_key_p = pub_key;
        *priv_key_p = priv_key;
        return 0;
      }
    }
    ulp_free_public_key(pub_key);
    ulp_free_private_key(priv_key);
    free(__ptr);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int ulp_generate_key_pair(size_t n, size_t l, uint64_t sk, uint64_t se, uint64_t q, ulp_public_key** pub_key_p, ulp_private_key** priv_key_p) {

    if(n == 0 || l == 0 || sk == 0 || se == 0 || q == 0 || pub_key_p == NULL || priv_key_p == NULL || q >= 0x8000000000000000)
        return -2;

    // allocate memory for keys
    ulp_public_key* pub_key = ulp_alloc_public_key(n, l);
    ulp_private_key* priv_key = ulp_alloc_private_key(n, l);
    uint64_t* SA = calloc(l*n, sizeof(q));
    if(pub_key == NULL || priv_key == NULL || SA == NULL)
        goto fail;

    // store parameters in key structs
    pub_key->se = se;
    pub_key->q = q;
    priv_key->q = q;

    // sample random data
    int err = 0;
    err += get_random_numbers(pub_key->A, n*n, q);
    err += get_random_numbers(pub_key->P, l*n, sk);
    err += get_random_numbers(priv_key->S, l*n, sk);
    if(err != 0)
        goto fail;

    // S*A
    for(size_t i = 0; i < l; i++) {
        for(size_t j = 0; j < n; j++) {
            for(size_t k = 0; k < n; k++) {
                SA[i*n+j] = (SA[i*n+j] + mulmod(priv_key->S[i*n+k], pub_key->A[k*n+j], q)) % q;
            }
        }
    }

    // P = E - S*A
    for(size_t i = 0; i < l*n; i++) {
        pub_key->P[i] = (pub_key->P[i] + q - SA[i]) % q;
    }

    // exit properly
    free(SA);
    *pub_key_p = pub_key;
    *priv_key_p = priv_key;
    return 0;


    // on failure, do cleanup
    fail:
        ulp_free_public_key(pub_key);
        ulp_free_private_key(priv_key);
        free(SA);
        return -1;

}